

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgskyc(fitsfile *fptr,char *keyname,int firstchar,int maxchar,int maxcomchar,char *value,
           int *valuelen,char *comm,int *comlen,int *status)

{
  char *in_stack_000000d8;
  int in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  char *in_stack_000000f0;
  fitsfile *in_stack_000000f8;
  int *in_stack_00000110;
  char *in_stack_00000118;
  int *in_stack_00000120;
  int *in_stack_00000128;
  undefined4 local_c;
  
  if (*(int *)value < 1) {
    ffglkut(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,
            in_stack_000000e4,in_stack_000000d8,in_stack_00000110,in_stack_00000118,
            in_stack_00000120,in_stack_00000128);
    local_c = *(int *)value;
  }
  else {
    local_c = *(int *)value;
  }
  return local_c;
}

Assistant:

int ffgskyc( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */ 
           int maxcomchar,      /* I - maximum length of comment to return */     
           char *value,         /* O - pointer to keyword value      */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int *comlen,        /* O - total length of the comment string */
           int  *status)        /* IO - error status                 */
{
   if (*status > 0)
      return(*status);

   ffglkut(fptr,keyname,firstchar,maxchar,maxcomchar,value,valuelen,
             comm,comlen,status);      
      
   return(*status);
}